

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_half
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          uint16_t value,semantic_tag tag,ser_context *context,error_code *ec)

{
  pointer plVar1;
  ushort uVar2;
  uint uVar3;
  int __exponent;
  double val;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sink
  ;
  write_double f;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  write_double local_60;
  
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((plVar1[-1].even_odd_ == 0) || (plVar1[-1].state_ == buffer)) {
    local_68.buf_ptr = &this->key_;
    (this->key_)._M_string_length = 0;
    *(this->key_)._M_dataplus._M_p = '\0';
    detail::write_double::write_double(&local_60,general,0);
    uVar3 = value >> 10 & 0x1f;
    uVar2 = value & 0x3ff;
    if (uVar3 == 0x1f) {
      if ((value & 0x3ff) == 0) {
        val = INFINITY;
      }
      else {
        val = nan("");
      }
    }
    else {
      if ((value >> 10 & 0x1f) == 0) {
        __exponent = -0x18;
      }
      else {
        uVar2 = uVar2 | 0x400;
        __exponent = uVar3 - 0x19;
      }
      val = ldexp((double)uVar2,__exponent);
    }
    if ((short)value < 0) {
      val = -val;
    }
    detail::write_double::operator()(&local_60,val,&local_68);
    if (local_60.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.to_double_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.to_double_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    plVar1 = (this->level_stack_).
             super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar1[-1].even_odd_ == 0) {
      if (plVar1[-1].state_ == buffer) {
        if (plVar1[-1].count_ != 0) {
          std::__cxx11::string::push_back((char)this + '8');
        }
        std::__cxx11::string::replace
                  ((ulong)&this->key_buffer_,(this->key_buffer_)._M_string_length,(char *)0x0,
                   (ulong)(this->key_)._M_dataplus._M_p);
        std::__cxx11::string::push_back((char)&this->key_buffer_);
      }
      else {
        local_60.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (this->key_)._M_dataplus._M_p;
        local_60.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(this->key_)._M_string_length;
        (*this->destination_->_vptr_basic_json_visitor[9])(this->destination_,&local_60,context,ec);
      }
      goto LAB_001da781;
    }
    if (plVar1[-1].state_ == buffer) {
      if ((plVar1[-1].type_ != object) && (plVar1[-1].count_ != 0)) {
        std::__cxx11::string::push_back((char)this + '8');
      }
      std::__cxx11::string::replace
                ((ulong)&this->key_buffer_,(this->key_buffer_)._M_string_length,(char *)0x0,
                 (ulong)(this->key_)._M_dataplus._M_p);
      goto LAB_001da781;
    }
  }
  (*this->destination_->_vptr_basic_json_visitor[0x11])
            (this->destination_,(ulong)value,tag,context,ec);
LAB_001da781:
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar1[-1].even_odd_ != 0) {
    plVar1[-1].count_ = plVar1[-1].count_ + 1;
  }
  if (plVar1[-1].type_ == object) {
    plVar1[-1].even_odd_ = (uint)(plVar1[-1].even_odd_ == 0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_half(uint16_t value, semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear();
                jsoncons::string_sink<string_type> sink(key_);
                jsoncons::detail::write_double f{float_chars_format::general,0};
                double x = binary::decode_half(value);
                f(x, sink);
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->half_value(value, tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }